

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

void __thiscall
SeedTree::SeedTree(SeedTree *this,reveal_list_t *reveallist,size_t num_leaves,limbo_salt_t *salt,
                  size_t rep_idx)

{
  bool bVar1;
  uint32_t uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *seed;
  size_t rep_idx_00;
  size_t sVar3;
  pointer in_RDX;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_RSI;
  vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_RDI;
  reference rVar4;
  type *right;
  type *left;
  size_t i_2;
  size_t last_non_leaf;
  size_t sibling;
  size_t node;
  size_t path_idx;
  size_t first_leaf_idx;
  size_t missing_leaf;
  anon_class_16_2_de91bc4a get_sibling;
  anon_class_8_1_8991fb9c_for_has_sibling has_sibling;
  size_t i_1;
  size_t i;
  size_t tree_depth;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  anon_class_8_1_8991fb9c_for_has_sibling *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  SeedTree *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  pointer poVar5;
  undefined1 __x;
  size_type in_stack_fffffffffffffe68;
  vector<bool,_std::allocator<bool>_> *this_00;
  ulong local_f0;
  size_t in_stack_ffffffffffffff40;
  uchar *salt_00;
  SeedTree *this_01;
  anon_class_16_2_de91bc4a local_98;
  reference local_80;
  reference local_70;
  long local_60;
  reference local_58;
  pointer local_48;
  ulong local_30;
  pointer local_18;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_10;
  
  poVar5 = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::vector((vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            *)0x131435);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(in_RDI + 1);
  in_RDI[1].
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI[2].
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = poVar5;
  in_RDI[1].
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in_RDI[1].
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = poVar5;
  in_RDI[2].
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x131469);
  __x = (undefined1)((ulong)poVar5 >> 0x38);
  in_RDI[2].
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_18;
  uVar2 = ceil_log2(0x131489);
  local_30._0_1_ = (byte)(uVar2 + 1);
  in_RDI[3].
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)local_18 +
                ((long)((1 << ((byte)local_30 & 0x1f)) + -1) -
                (long)(1 << ((byte)local_30 - 1 & 0x1f))));
  local_30 = (ulong)(uVar2 + 1);
  std::vector<bool,_std::allocator<bool>_>::resize(this_00,in_stack_fffffffffffffe68,(bool)__x);
  for (local_48 = (pointer)((long)in_RDI[3].
                                  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start - (long)local_18);
      local_48 <
      in_RDI[3].
      super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
      local_48 = (pointer)((long)&(local_48->
                                  super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                          + 1)) {
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                       (size_type)in_stack_fffffffffffffde8);
    local_58 = rVar4;
    std::_Bit_reference::operator=(&local_58,true);
  }
  local_60 = (long)in_RDI[3].
                   super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)local_18;
  do {
    if (local_60 == 0) {
      local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                            (size_type)in_stack_fffffffffffffde8);
      std::_Bit_reference::operator=(&local_80,true);
      std::
      vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::resize((vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               (size_type)in_stack_fffffffffffffde8);
      this_01 = (SeedTree *)
                local_10[1].
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      seed = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)in_RDI[3].
                    super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start -
             (long)in_RDI[2].
                   super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      salt_00 = (uchar *)0x0;
      rep_idx_00 = (long)&(seed->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                          _M_impl.super__Vector_impl_data._M_start +
                   (long)&(this_01->_data).
                          super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data;
      while (rep_idx_00 != 0) {
        bVar1 = SeedTree::anon_class_16_2_de91bc4a::anon_class_8_1_8991fb9c_for_has_sibling::
                operator()(in_stack_fffffffffffffdd8,
                           CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
        if (bVar1) {
          in_stack_ffffffffffffff40 =
               SeedTree::anon_class_16_2_de91bc4a::operator()(&local_98,rep_idx_00);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::operator[](local_10,(size_type)salt_00);
          std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
          optional<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_true>
                    ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                     CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffdc8);
          std::
          vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::operator[](in_RDI,in_stack_ffffffffffffff40);
          std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator=
                    ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                     CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                     in_stack_fffffffffffffdc8);
          std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
                    ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                     0x131847);
        }
        salt_00 = ((limbo_salt_t *)salt_00)->_M_elems + 1;
        rep_idx_00 = get_parent(rep_idx_00);
      }
      sVar3 = get_parent((size_t)((long)&in_RDI[3].
                                         super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].
                                         super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                         ._M_payload.
                                         super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                                 + 0x1f));
      for (local_f0 = 0; local_f0 <= sVar3; local_f0 = local_f0 + 1) {
        bVar1 = node_exists(in_stack_fffffffffffffde8,
                            CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
        if (bVar1) {
          std::
          vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::operator[](in_RDI,local_f0);
          bVar1 = std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
                  has_value((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
                            )0x13190d);
          if (bVar1) {
            std::
            vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::operator[](in_RDI,local_f0);
            in_stack_fffffffffffffde8 =
                 (SeedTree *)
                 std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::value
                           ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
                            )CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
            expandSeed(this_01,seed,(limbo_salt_t *)salt_00,rep_idx_00,in_stack_ffffffffffffff40);
            std::
            get<0ul,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)0x131980);
            std::
            get<1ul,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)0x131992);
            in_stack_fffffffffffffde7 =
                 node_exists(in_stack_fffffffffffffde8,
                             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
            if ((bool)in_stack_fffffffffffffde7) {
              std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
              optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_true>
                        ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                         CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffdc8);
              std::
              vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::operator[](in_RDI,local_f0 * 2 + 1);
              std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator=
                        ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                         CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                         in_stack_fffffffffffffdc8);
              std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
                        ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                         0x131a14);
            }
            in_stack_fffffffffffffdd7 =
                 node_exists(in_stack_fffffffffffffde8,
                             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
            if ((bool)in_stack_fffffffffffffdd7) {
              std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
              optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_true>
                        ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                         CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffdc8);
              std::
              vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::operator[](in_RDI,local_f0 * 2 + 2);
              std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator=
                        ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                         CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                         in_stack_fffffffffffffdc8);
              std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
                        ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                         0x131ab6);
            }
            std::
            pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~pair((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
          }
        }
      }
      return;
    }
    bVar1 = node_exists(in_stack_fffffffffffffde8,
                        CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    if (bVar1) {
LAB_0013163c:
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)
                         CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                         (size_type)in_stack_fffffffffffffde8);
      local_70 = rVar4;
      std::_Bit_reference::operator=(&local_70,true);
    }
    else {
      bVar1 = node_exists(in_stack_fffffffffffffde8,
                          CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
      if (bVar1) goto LAB_0013163c;
    }
    local_60 = local_60 + -1;
  } while( true );
}

Assistant:

SeedTree::SeedTree(const reveal_list_t &reveallist, const size_t num_leaves,
                   const limbo_salt_t &salt, const size_t rep_idx)
    : _data(), _node_exists(), _num_leaves(num_leaves) {
  size_t tree_depth = 1 + ceil_log2(num_leaves);

  _num_total_nodes =
      ((1 << (tree_depth)) - 1) -
      ((1 << (tree_depth - 1)) -
       num_leaves); /* Num nodes in complete - number of missing leaves */

  _node_exists.resize(_num_total_nodes);
  for (size_t i = _num_total_nodes - num_leaves; i < _num_total_nodes; i++) {
    _node_exists[i] = true;
  }

  for (size_t i = _num_total_nodes - num_leaves; i > 0; i--) {
    if (node_exists(2 * i + 1) || node_exists(2 * i + 2)) {
      _node_exists[i] = true;
    }
  }
  _node_exists[0] = true;
  _data.resize(_num_total_nodes);

  auto has_sibling = [this](size_t node) -> bool {
    if (!node_exists(node)) {
      return 0;
    }

    if ((node % 2 == 1) && !node_exists(node + 1)) {
      return 0;
    }

    return 1;
  };

  auto get_sibling = [this, has_sibling](size_t node) -> size_t {
    assert(node < _num_total_nodes);
    assert(node != 0);
    assert(has_sibling(node));
    if ((node % 2 == 1)) {
      if (node + 1 < _num_total_nodes) {
        return node + 1;
      } else {
        assert(!"getSibling: request for node with no sibling");
        return 0;
      }
    } else {
      return node - 1;
    }
  };

  size_t missing_leaf = reveallist.second;
  size_t first_leaf_idx = _num_total_nodes - _num_leaves;
  size_t path_idx = 0;
  for (size_t node = first_leaf_idx + missing_leaf; node != 0;
       node = get_parent(node)) {
    if (!has_sibling(node)) {
      path_idx++;
      continue;
    }
    size_t sibling = get_sibling(node);
    _data[sibling] = std::optional(reveallist.first[path_idx]);
    path_idx++;
  }

  size_t last_non_leaf = get_parent(_num_total_nodes - 1);
  for (size_t i = 0; i <= last_non_leaf; i++) {
    if (!node_exists(i) || !_data[i].has_value())
      continue;
    auto [left, right] = expandSeed(_data[i].value(), salt, rep_idx, i);
    if (node_exists(2 * i + 1)) {
      _data[2 * i + 1] = std::optional(left);
    }
    if (node_exists(2 * i + 2)) {
      _data[2 * i + 2] = std::optional(right);
    }
  }
}